

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

void __thiscall
cmServerProtocol1::HandleCMakeFileChanges(cmServerProtocol1 *this,string *path,int event,int status)

{
  Value *pVVar1;
  Value local_148;
  Value local_120;
  Value local_f8;
  undefined1 local_d0 [8];
  Value properties;
  undefined1 local_80 [8];
  Value obj;
  Value local_48;
  int local_20;
  uint local_1c;
  int status_local;
  int event_local;
  string *path_local;
  cmServerProtocol1 *this_local;
  
  local_20 = status;
  local_1c = event;
  _status_local = path;
  path_local = (string *)this;
  if (status == 0) {
    if ((this->m_isDirty & 1U) == 0) {
      this->m_isDirty = true;
      Json::Value::Value(&local_48,objectValue);
      cmServerProtocol::SendSignal
                (&this->super_cmServerProtocol,&kDIRTY_SIGNAL_abi_cxx11_,&local_48);
      Json::Value::~Value(&local_48);
    }
    Json::Value::Value((Value *)local_80,objectValue);
    Json::Value::Value((Value *)&properties.limit_,_status_local);
    pVVar1 = Json::Value::operator[]((Value *)local_80,&kPATH_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar1,(Value *)&properties.limit_);
    Json::Value::~Value((Value *)&properties.limit_);
    Json::Value::Value((Value *)local_d0,arrayValue);
    if ((local_1c & 1) != 0) {
      Json::Value::Value(&local_f8,&kRENAME_PROPERTY_VALUE_abi_cxx11_);
      Json::Value::append((Value *)local_d0,&local_f8);
      Json::Value::~Value(&local_f8);
    }
    if ((local_1c & 2) != 0) {
      Json::Value::Value(&local_120,&kCHANGE_PROPERTY_VALUE_abi_cxx11_);
      Json::Value::append((Value *)local_d0,&local_120);
      Json::Value::~Value(&local_120);
    }
    Json::Value::Value(&local_148,(Value *)local_d0);
    pVVar1 = Json::Value::operator[]((Value *)local_80,&kPROPERTIES_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar1,&local_148);
    Json::Value::~Value(&local_148);
    cmServerProtocol::SendSignal
              (&this->super_cmServerProtocol,&kFILE_CHANGE_SIGNAL_abi_cxx11_,(Value *)local_80);
    Json::Value::~Value((Value *)local_d0);
    Json::Value::~Value((Value *)local_80);
    return;
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                ,0x1ae,
                "void cmServerProtocol1::HandleCMakeFileChanges(const std::string &, int, int)");
}

Assistant:

void cmServerProtocol1::HandleCMakeFileChanges(const std::string& path,
                                               int event, int status)
{
  assert(status == 0);
  static_cast<void>(status);

  if (!m_isDirty) {
    m_isDirty = true;
    SendSignal(kDIRTY_SIGNAL, Json::objectValue);
  }
  Json::Value obj = Json::objectValue;
  obj[kPATH_KEY] = path;
  Json::Value properties = Json::arrayValue;
  if (event & UV_RENAME) {
    properties.append(kRENAME_PROPERTY_VALUE);
  }
  if (event & UV_CHANGE) {
    properties.append(kCHANGE_PROPERTY_VALUE);
  }

  obj[kPROPERTIES_KEY] = properties;
  SendSignal(kFILE_CHANGE_SIGNAL, obj);
}